

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimerPre.h
# Opt level: O1

void __thiscall HTimerPre::reset(HTimerPre *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [12];
  undefined4 uVar3;
  undefined1 auVar4 [16];
  timeval tv;
  timeval local_20;
  
  this->itemTicks[0xc] = 0.0;
  this->itemTicks[0xd] = 0.0;
  this->itemTicks[10] = 0.0;
  this->itemTicks[0xb] = 0.0;
  this->itemTicks[8] = 0.0;
  this->itemTicks[9] = 0.0;
  this->itemTicks[6] = 0.0;
  this->itemTicks[7] = 0.0;
  this->itemTicks[4] = 0.0;
  this->itemTicks[5] = 0.0;
  this->itemTicks[2] = 0.0;
  this->itemTicks[3] = 0.0;
  this->itemTicks[0] = 0.0;
  this->itemTicks[1] = 0.0;
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  this->startTime = (double)local_20.tv_usec / 1000000.0 + (double)local_20.tv_sec;
  uVar1 = rdtsc();
  uVar3 = (undefined4)((ulong)uVar1 >> 0x20);
  auVar2._4_4_ = uVar3;
  auVar2._0_4_ = uVar3;
  auVar2._8_4_ = 0;
  auVar4._0_12_ = auVar2 << 0x20;
  auVar4._12_4_ = 0x45300000;
  this->startTick =
       (auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  return;
}

Assistant:

void reset() {
        for (int i = 0; i < HTICK_ITEMS_COUNT_PRE; i++)
            itemTicks[i] = 0;
        startTime = getWallTime();
        startTick = getWallTick();
    }